

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.cpp
# Opt level: O2

void CorUnix::MTX_InternalEnterCriticalSection
               (CPalThread *pThread,PCRITICAL_SECTION pCriticalSection)

{
  int iVar1;
  HANDLE pVVar2;
  char *callingFuncName;
  
  callingFuncName = (char *)pCriticalSection;
  if (pCriticalSection->dwInitState == 0) {
    fprintf(_stderr,"] %s %s:%d","MTX_InternalEnterCriticalSection",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
            ,0x5d7);
    callingFuncName = "Expression: PalCsNotInitialized != pPalCriticalSection->cisInitState\n";
    fprintf(_stderr,"Expression: PalCsNotInitialized != pPalCriticalSection->cisInitState\n");
  }
  pVVar2 = (HANDLE)ObtainCurrentThreadIdImpl(pThread,callingFuncName);
  if (pCriticalSection->OwningThread == pVVar2) {
    iVar1 = pCriticalSection->RecursionCount;
    if (iVar1 < 1) {
      fprintf(_stderr,"] %s %s:%d","MTX_InternalEnterCriticalSection",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
              ,0x5de);
      fprintf(_stderr,"Expression: 0 < pPalCriticalSection->RecursionCount\n");
      iVar1 = pCriticalSection->RecursionCount;
    }
    pCriticalSection->RecursionCount = iVar1 + 1;
  }
  else {
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)&pCriticalSection->csnds);
    if (iVar1 != 0) {
      fprintf(_stderr,"] %s %s:%d","MTX_InternalEnterCriticalSection",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
              ,0x5e4);
      fprintf(_stderr,"Expression: 0 == iRet\n");
    }
    pCriticalSection->OwningThread = pVVar2;
    pCriticalSection->RecursionCount = 1;
  }
  return;
}

Assistant:

void MTX_InternalEnterCriticalSection(
        CPalThread * pThread,
        PCRITICAL_SECTION pCriticalSection)
#endif // MUTEX_BASED_CSS

    {
        PAL_CRITICAL_SECTION * pPalCriticalSection =
            reinterpret_cast<PAL_CRITICAL_SECTION*>(pCriticalSection);
        int iRet;
        SIZE_T threadId;

        _ASSERTE(PalCsNotInitialized != pPalCriticalSection->cisInitState);

        threadId = ObtainCurrentThreadId(pThread);

        /* check if the current thread already owns the criticalSection */
        if (pPalCriticalSection->OwningThread == threadId)
        {
            _ASSERTE(0 < pPalCriticalSection->RecursionCount);
            pPalCriticalSection->RecursionCount += 1;
            return;
        }

        iRet = pthread_mutex_lock(&pPalCriticalSection->csndNativeData.mutex);
        _ASSERTE(0 == iRet);

        pPalCriticalSection->OwningThread = threadId;
        pPalCriticalSection->RecursionCount = 1;
    }